

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.c
# Opt level: O0

ZydisRegisterWidth ZydisRegisterGetWidth(ZydisMachineMode mode,ZydisRegister reg)

{
  ZydisRegister reg_local;
  ZydisMachineMode mode_local;
  
  if (reg < (ZYDIS_REGISTER_IA32_KERNEL_GS_BASE|ZYDIS_REGISTER_AL)) {
    if (mode == ZYDIS_MACHINE_MODE_LONG_64) {
      reg_local._2_2_ = REG_LOOKUP[reg].width64;
    }
    else {
      reg_local._2_2_ = REG_LOOKUP[reg].width;
    }
  }
  else {
    reg_local._2_2_ = ZYDIS_REGISTER_NONE >> 0x10;
  }
  return reg_local._2_2_;
}

Assistant:

ZydisRegisterWidth ZydisRegisterGetWidth(ZydisMachineMode mode, ZydisRegister reg)
{
    if ((ZyanUSize)reg >= ZYAN_ARRAY_LENGTH(REG_LOOKUP))
    {
        return 0;
    }

    return (mode == ZYDIS_MACHINE_MODE_LONG_64)
        ? REG_LOOKUP[reg].width64
        : REG_LOOKUP[reg].width;
}